

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O2

ImportDefinition * __thiscall
flatbuffers::ts::TsGenerator::AddImport<flatbuffers::EnumDef>
          (ImportDefinition *__return_storage_ptr__,TsGenerator *this,import_set *imports,
          Definition *dependent,EnumDef *dependency)

{
  IdlNamer *this_00;
  Namespace *pNVar1;
  pointer pbVar2;
  pointer pbVar3;
  bool force_ns_wrap;
  iterator iVar4;
  string *psVar5;
  TsGenerator *pTVar6;
  char *__s;
  ulong uVar7;
  EnumDef *pEVar8;
  allocator<char> local_2f2;
  allocator<char> local_2f1;
  TsGenerator *local_2f0;
  EnumDef *local_2e8;
  ImportDefinition *local_2e0;
  Definition *local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  string local_2b0;
  string import_extension;
  string rel_file_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string bare_file_path;
  string symbols_expression;
  string name;
  string object_name;
  string import_name;
  string unique_name;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>
  local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->namer_;
  local_2d8 = dependent;
  IdlNamer::NamespacedType_abi_cxx11_(&unique_name,this_00,&dependency->super_Definition);
  iVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
          ::find(imports,&unique_name);
  if ((_Rb_tree_header *)iVar4._M_node == &(imports->_M_t)._M_impl.super__Rb_tree_header) {
    local_2f0 = this;
    local_2e8 = dependency;
    local_2e0 = __return_storage_ptr__;
    (*(this_00->super_Namer)._vptr_Namer[0xf])(&import_name,this_00,dependency);
    force_ns_wrap = CheckIfNameClashes(imports,&import_name);
    psVar5 = &unique_name;
    if (!force_ns_wrap) {
      psVar5 = &import_name;
    }
    std::__cxx11::string::string((string *)&name,(string *)psVar5);
    pEVar8 = local_2e8;
    pTVar6 = local_2f0;
    GetTypeName_abi_cxx11_(&object_name,local_2f0,local_2e8,true,force_ns_wrap);
    GenSymbolExpression(&symbols_expression,pTVar6,pEVar8,force_ns_wrap,&import_name,&name,
                        &object_name);
    bare_file_path._M_dataplus._M_p = (pointer)&bare_file_path.field_2;
    bare_file_path._M_string_length = 0;
    rel_file_path._M_dataplus._M_p = (pointer)&rel_file_path.field_2;
    rel_file_path._M_string_length = 0;
    bare_file_path.field_2._M_local_buf[0] = '\0';
    rel_file_path.field_2._M_local_buf[0] = '\0';
    pNVar1 = local_2d8->defined_namespace;
    if (pNVar1 == (Namespace *)0x0) {
      std::__cxx11::string::append((char *)&rel_file_path);
      pTVar6 = local_2f0;
      pEVar8 = local_2e8;
      __return_storage_ptr__ = local_2e0;
    }
    else {
      uVar7 = 0;
      while( true ) {
        __return_storage_ptr__ = local_2e0;
        pEVar8 = local_2e8;
        pTVar6 = local_2f0;
        pbVar2 = (pNVar1->components).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar3 = (pNVar1->components).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((ulong)((long)pbVar3 - (long)pbVar2 >> 5) <= uVar7) break;
        if (uVar7 == 0) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"..",&local_2f1);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"..",&local_2f2);
          std::operator+(&local_140.first,'/',&local_50);
        }
        std::__cxx11::string::append((string *)&rel_file_path);
        std::__cxx11::string::~string((string *)&local_140);
        if (uVar7 != 0) {
          std::__cxx11::string::~string((string *)&local_50);
        }
        uVar7 = uVar7 + 1;
      }
      if (pbVar3 == pbVar2) {
        std::__cxx11::string::append((char *)&rel_file_path);
      }
    }
    Namer::Directories(&local_2b0,&this_00->super_Namer,
                       &((pEVar8->super_Definition).defined_namespace)->components,OutputPath,
                       kUpperCamel);
    std::operator+(&import_extension,'/',&local_2b0);
    (*(this_00->super_Namer)._vptr_Namer[0xc])(&local_2d0,this_00,pEVar8,3);
    std::operator+(&local_140.first,&import_extension,&local_2d0);
    std::__cxx11::string::append((string *)&bare_file_path);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&import_extension);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::append((string *)&rel_file_path);
    anon_unknown_10::ImportDefinition::ImportDefinition(__return_storage_ptr__);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->object_name);
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->bare_file_path);
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->rel_file_path);
    __s = ".js";
    if ((((pTVar6->super_BaseGenerator).parser_)->opts).ts_no_import_ext != false) {
      __s = "";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&import_extension,__s,(allocator<char> *)&local_140);
    std::operator+(&local_240,"import { ",&symbols_expression);
    std::operator+(&local_220,&local_240," } from \'");
    std::operator+(&local_2d0,&local_220,&rel_file_path);
    std::operator+(&local_2b0,&local_2d0,&import_extension);
    std::operator+(&local_140.first,&local_2b0,"\';");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->import_statement,(string *)&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_240);
    std::operator+(&local_240,"export { ",&symbols_expression);
    std::operator+(&local_220,&local_240," } from \'.");
    std::operator+(&local_2d0,&local_220,&bare_file_path);
    std::operator+(&local_2b0,&local_2d0,&import_extension);
    std::operator+(&local_140.first,&local_2b0,"\';");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->export_statement,(string *)&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_240);
    __return_storage_ptr__->dependency = &pEVar8->super_Definition;
    __return_storage_ptr__->dependent = local_2d8;
    std::
    make_pair<std::__cxx11::string_const&,flatbuffers::(anonymous_namespace)::ImportDefinition&>
              (&local_140,&unique_name,__return_storage_ptr__);
    std::
    map<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::(anonymous_namespace)::ImportDefinition>>>
    ::insert<std::pair<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition>>
              ((map<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::(anonymous_namespace)::ImportDefinition>>>
                *)imports,&local_140);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>
    ::~pair(&local_140);
    std::__cxx11::string::~string((string *)&import_extension);
    std::__cxx11::string::~string((string *)&rel_file_path);
    std::__cxx11::string::~string((string *)&bare_file_path);
    std::__cxx11::string::~string((string *)&symbols_expression);
    std::__cxx11::string::~string((string *)&object_name);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&import_name);
  }
  else {
    anon_unknown_10::ImportDefinition::ImportDefinition
              (__return_storage_ptr__,(ImportDefinition *)(iVar4._M_node + 2));
  }
  std::__cxx11::string::~string((string *)&unique_name);
  return __return_storage_ptr__;
}

Assistant:

ImportDefinition AddImport(import_set &imports, const Definition &dependent,
                             const DefinitionT &dependency) {
    // The unique name of the dependency, fully qualified in its namespace.
    const std::string unique_name = GetTypeName(
        dependency, /*object_api = */ false, /*force_ns_wrap=*/true);

    // Look if we have already added this import and return its name if found.
    const auto import_pair = imports.find(unique_name);
    if (import_pair != imports.end()) { return import_pair->second; }

    // Check if this name would have a name clash with another type. Just use
    // the "base" name (properly escaped) without any namespacing applied.
    const std::string import_name = GetTypeName(dependency);
    const bool has_name_clash = CheckIfNameClashes(imports, import_name);

    // If we have a name clash, use the unique name, otherwise use simple name.
    std::string name = has_name_clash ? unique_name : import_name;

    const std::string object_name =
        GetTypeName(dependency, /*object_api=*/true, has_name_clash);

    const std::string symbols_expression = GenSymbolExpression(
        dependency, has_name_clash, import_name, name, object_name);

    std::string bare_file_path;
    std::string rel_file_path;
    if (dependent.defined_namespace) {
      const auto &dep_comps = dependent.defined_namespace->components;
      for (size_t i = 0; i < dep_comps.size(); i++) {
        rel_file_path += i == 0 ? ".." : (kPathSeparator + std::string(".."));
      }
      if (dep_comps.size() == 0) { rel_file_path += "."; }
    } else {
      rel_file_path += "..";
    }

    bare_file_path +=
        kPathSeparator +
        namer_.Directories(dependency.defined_namespace->components,
                           SkipDir::OutputPath) +
        namer_.File(dependency, SkipFile::SuffixAndExtension);
    rel_file_path += bare_file_path;

    ImportDefinition import;
    import.name = name;
    import.object_name = object_name;
    import.bare_file_path = bare_file_path;
    import.rel_file_path = rel_file_path;
    std::string import_extension = parser_.opts.ts_no_import_ext ? "" : ".js";
    import.import_statement = "import { " + symbols_expression + " } from '" +
                              rel_file_path + import_extension + "';";
    import.export_statement = "export { " + symbols_expression + " } from '." +
                              bare_file_path + import_extension + "';";
    import.dependency = &dependency;
    import.dependent = &dependent;

    imports.insert(std::make_pair(unique_name, import));

    return import;
  }